

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O3

void __thiscall
dg::llvmdg::SDG2Dot::dumpParams(SDG2Dot *this,ostream *out,DGParameters *params,string *name)

{
  ulong *puVar1;
  ulong uVar2;
  DGParameters *pDVar3;
  ostream *poVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  ulong *puVar8;
  DGNode *noret;
  DGParameters *__range2;
  DGNode *local_48;
  DGParameters *local_40;
  string *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"    subgraph cluster_params_in_",0x1f);
  poVar4 = std::ostream::_M_insert<void_const*>(out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"      label=\"",0xd);
  local_38 = name;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (input)\"\n",10);
  puVar8 = *(ulong **)(params + 0x18);
  puVar1 = *(ulong **)(params + 0x20);
  local_40 = params;
  if (puVar8 != puVar1) {
    do {
      uVar2 = *puVar8;
      local_48 = (DGNode *)(uVar2 + 0x20);
      std::
      _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
      ::_M_insert_unique<dg::sdg::DGNode*>
                ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                  *)&this->dumpedNodes,&local_48);
      p_Var6 = (this->_llvmsdg->_rev_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_00115a2a:
        p_Var6 = (_Base_ptr)0x0;
      }
      else {
        p_Var5 = &(this->_llvmsdg->_rev_mapping)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var5->_M_header;
        do {
          if (*(ulong *)(p_Var6 + 1) >= uVar2) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var5) || (uVar2 < *(ulong *)(p_Var7 + 1)))
        goto LAB_00115a2a;
        p_Var6 = p_Var7[1]._M_parent;
      }
      dumpNode(this,out,(DGNode *)(uVar2 + 0x20),(Value *)p_Var6,(char *)0x0);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    subgraph cluster_params_out_",0x20);
  pDVar3 = local_40;
  poVar4 = std::ostream::_M_insert<void_const*>(out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"      label=\"",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(local_38->_M_dataplus)._M_p,local_38->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (output)\"\n",0xb);
  puVar8 = *(ulong **)(pDVar3 + 0x18);
  puVar1 = *(ulong **)(pDVar3 + 0x20);
  if (puVar8 != puVar1) {
    do {
      uVar2 = *puVar8;
      local_48 = (DGNode *)(uVar2 + 0x220);
      std::
      _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
      ::_M_insert_unique<dg::sdg::DGNode*>
                ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                  *)&this->dumpedNodes,&local_48);
      p_Var6 = (this->_llvmsdg->_rev_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
      ;
      if (p_Var6 == (_Base_ptr)0x0) {
LAB_00115b49:
        p_Var6 = (_Base_ptr)0x0;
      }
      else {
        p_Var5 = &(this->_llvmsdg->_rev_mapping)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var5->_M_header;
        do {
          if (*(ulong *)(p_Var6 + 1) >= uVar2) {
            p_Var7 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var5) || (uVar2 < *(ulong *)(p_Var7 + 1)))
        goto LAB_00115b49;
        p_Var6 = p_Var7[1]._M_parent;
      }
      dumpNode(this,out,(DGNode *)(uVar2 + 0x220),(Value *)p_Var6,(char *)0x0);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  local_48 = *(DGNode **)(local_40 + 8);
  if (local_48 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>
              ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes,&local_48);
    dumpNode(this,out,local_48,(Value *)0x0,"noret");
  }
  local_48 = *(DGNode **)(local_40 + 0x10);
  if (local_48 != (DGNode *)0x0) {
    std::
    _Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
    ::_M_insert_unique<dg::sdg::DGNode*const&>
              ((_Rb_tree<dg::sdg::DGNode*,dg::sdg::DGNode*,std::_Identity<dg::sdg::DGNode*>,std::less<dg::sdg::DGNode*>,std::allocator<dg::sdg::DGNode*>>
                *)&this->dumpedNodes,&local_48);
    dumpNode(this,out,local_48,(Value *)0x0,"ret");
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"    }\n",6);
  return;
}

Assistant:

void dumpParams(std::ostream &out, sdg::DGParameters &params,
                    const std::string &name) const {
        /// input parameters
        out << "    subgraph cluster_params_in_" << &params << " {\n";
        out << "      label=\"" << name << " (input)\"\n";
        for (auto &param : params) {
            auto &nd = param.getInputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        out << "    }\n";

        /// output parameters
        out << "    subgraph cluster_params_out_" << &params << " {\n";
        out << "      label=\"" << name << " (output)\"\n";
        for (auto &param : params) {
            auto &nd = param.getOutputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        if (auto *noret = params.getNoReturn()) {
            dumpedNodes.insert(noret);
            dumpNode(out, *noret, nullptr, "noret");
        }
        if (auto *ret = params.getReturn()) {
            dumpedNodes.insert(ret);
            dumpNode(out, *ret, nullptr, "ret");
        }
        out << "    }\n";
    }